

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboRepeatedClearBlitRboCase::render
          (FboRepeatedClearBlitRboCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  bool bVar3;
  int ndx;
  long lVar4;
  int dstX0;
  deUint32 *renderbuffers;
  int iVar5;
  deUint32 *framebuffers;
  bool bVar6;
  int iVar7;
  float fVar8;
  deUint32 fbos [2];
  TextureFormat fboFormat;
  Vec4 color;
  deUint32 rbos [2];
  Random rnd;
  TextureFormatInfo fmtInfo;
  
  fboFormat = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&fboFormat);
  deRandom_init(&rnd.m_rnd,0x1153f3e);
  lVar4 = 0;
  framebuffers = fbos;
  fbos[0] = 0;
  fbos[1] = 0;
  renderbuffers = rbos;
  rbos[0] = 0;
  rbos[1] = 0;
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenFramebuffers(this_00,2,framebuffers);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,2,renderbuffers);
  bVar3 = true;
  do {
    bVar6 = bVar3;
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers);
    sglr::ContextWrapper::glRenderbufferStorage
              (this_00,0x8d41,(this->super_FboColorbufferCase).m_format,(&DAT_01bd7688)[lVar4],
               (&DAT_01bd7688)[lVar4]);
    FboTestCase::checkError((FboTestCase *)this);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,*renderbuffers);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    lVar4 = 1;
    renderbuffers = rbos + 1;
    framebuffers = fbos + 1;
    bVar3 = false;
  } while (bVar6);
  color.m_data[0] = 0.0;
  color.m_data[1] = 0.0;
  color.m_data[2] = 0.0;
  color.m_data[3] = 0.0;
  FboTestCase::clearColorBuffer((FboTestCase *)this,&fboFormat,&color);
  iVar7 = 0;
  do {
    iVar5 = 0;
    do {
      color.m_data[0] = 0.0;
      color.m_data[1] = 0.0;
      color.m_data[2] = 0.0;
      color.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        fVar1 = fmtInfo.valueMin.m_data[lVar4];
        fVar2 = fmtInfo.valueMax.m_data[lVar4];
        fVar8 = deRandom_getFloat(&rnd.m_rnd);
        color.m_data[lVar4] = fVar8 * (fVar2 - fVar1) + fVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbos[0]);
      FboTestCase::clearColorBuffer((FboTestCase *)this,&fboFormat,&color);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,fbos[1]);
      dstX0 = iVar5 << 4;
      iVar5 = iVar5 + 1;
      sglr::ContextWrapper::glBlitFramebuffer
                (this_00,0,0,0x10,0x10,dstX0,iVar7 * 0x10,iVar5 * 0x10,iVar7 * 0x10 + 0x10,0x4000,
                 0x2600);
    } while (iVar5 != 4);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 4);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbos[1]);
  FboTestCase::readPixels
            ((FboTestCase *)this,dst,0,0,0x40,0x40,&fboFormat,&fmtInfo.lookupScale,
             &fmtInfo.lookupBias);
  FboTestCase::checkError((FboTestCase *)this);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const tcu::TextureFormat		fboFormat		= glu::mapGLInternalFormat(m_format);
		const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(fboFormat);
		const int						numRowsCols		= 4;
		const int						cellSize		= 16;
		const int						fboSizes[]		= { cellSize, cellSize*numRowsCols };

		de::Random						rnd				(18169662);
		deUint32						fbos[]			= { 0, 0 };
		deUint32						rbos[]			= { 0, 0 };

		glGenFramebuffers(2, &fbos[0]);
		glGenRenderbuffers(2, &rbos[0]);

		for (int fboNdx = 0; fboNdx < DE_LENGTH_OF_ARRAY(fbos); fboNdx++)
		{
			glBindRenderbuffer(GL_RENDERBUFFER, rbos[fboNdx]);
			glRenderbufferStorage(GL_RENDERBUFFER, m_format, fboSizes[fboNdx], fboSizes[fboNdx]);
			checkError();

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[fboNdx]);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbos[fboNdx]);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// larger fbo bound -- clear to transparent black
		clearColorBuffer(fboFormat, Vec4(0.0f));

		for (int cellY = 0; cellY < numRowsCols; cellY++)
		for (int cellX = 0; cellX < numRowsCols; cellX++)
		{
			const Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[0]);
			clearColorBuffer(fboFormat, color);

			glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbos[1]);
			glBlitFramebuffer(0, 0, cellSize, cellSize, cellX*cellSize, cellY*cellSize, (cellX+1)*cellSize, (cellY+1)*cellSize, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		}

		glBindFramebuffer(GL_FRAMEBUFFER, fbos[1]);
		readPixels(dst, 0, 0, fboSizes[1], fboSizes[1], fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}